

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

void Spl_ManLutFanouts_rec
               (Gia_Man_t *p,int iObj,Vec_Int_t *vFanouts,Vec_Bit_t *vMarksNo,Vec_Bit_t *vMarksCIO)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  int iVar6;
  
  if ((-1 < iObj) && (iObj < vMarksNo->nSize)) {
    uVar2 = (uint)iObj >> 5;
    uVar5 = 1 << ((byte)iObj & 0x1f);
    if (((uint)vMarksNo->pArray[uVar2] >> (iObj & 0x1fU) & 1) == 0) {
      if (vMarksCIO->nSize <= iObj) goto LAB_007dcf67;
      uVar1 = vMarksCIO->pArray[uVar2];
      if ((uVar1 & uVar5) == 0) {
        if (p->vMapping2->nSize <= iObj) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if (p->vMapping2->pArray[(uint)iObj].nSize != 0) {
          vMarksCIO->pArray[uVar2] = uVar1 | uVar5;
          Vec_IntPush(vFanouts,iObj);
          return;
        }
        pVVar4 = p->vFanoutNums;
        if (iObj < pVVar4->nSize) {
          iVar6 = 0;
          while( true ) {
            if (pVVar4->pArray[(uint)iObj] <= iVar6) {
              return;
            }
            uVar2 = p->vFanout->nSize;
            if ((int)uVar2 <= iObj) break;
            piVar3 = p->vFanout->pArray;
            uVar5 = piVar3[(uint)iObj] + iVar6;
            if (((int)uVar5 < 0) || (uVar2 <= uVar5)) break;
            Spl_ManLutFanouts_rec(p,piVar3[uVar5],vFanouts,vMarksNo,vMarksCIO);
            iVar6 = iVar6 + 1;
            pVVar4 = p->vFanoutNums;
            if (pVVar4->nSize <= iObj) break;
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
    }
    return;
  }
LAB_007dcf67:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
}

Assistant:

void Spl_ManLutFanouts_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vFanouts, Vec_Bit_t * vMarksNo, Vec_Bit_t * vMarksCIO )
{
    int iFanout, i;
    if ( Vec_BitEntry(vMarksNo, iObj) || Vec_BitEntry(vMarksCIO, iObj) )
        return;
    if ( Gia_ObjIsLut2(p, iObj) )
    {
        Vec_BitWriteEntry( vMarksCIO, iObj, 1 );
        Vec_IntPush( vFanouts, iObj );
        return;
    }
    Gia_ObjForEachFanoutStaticId( p, iObj, iFanout, i )
        Spl_ManLutFanouts_rec( p, iFanout, vFanouts, vMarksNo, vMarksCIO );
}